

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall Js::ByteCodeWriter::EnsureLongBranch(ByteCodeWriter *this,OpCode op)

{
  Type TVar1;
  int iVar2;
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  Type pJVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ByteCodeLabel labelID;
  undefined4 *puVar10;
  Type *pTVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  uint firstUnknownJumpInfo;
  bool bVar18;
  int local_44;
  uint local_38;
  
  if (this->useBranchIsland == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xb08,"(useBranchIsland)","useBranchIsland");
    if (!bVar6) {
LAB_008a450c:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar10 = 0;
  }
  local_38 = (this->m_byteCodeData).currentOffset;
  if (((int)local_38 < this->nextBranchIslandOffset) || (this->inEnsureLongBranch == true)) {
    this->lastOpcode = op;
  }
  else {
    bVar6 = OpCodeAttr::HasFallThrough(this->lastOpcode);
    bVar18 = this->lastOpcode != Leave;
    this->lastOpcode = op;
    if ((((bVar18 && !bVar6) || (bVar7 = OpCodeAttr::HasFallThrough(op), bVar7)) ||
        (op == StatementBoundary)) || (op == Label)) {
      pLVar3 = this->m_jumpOffsets;
      firstUnknownJumpInfo = this->firstUnknownJumpInfo;
      iVar16 = (pLVar3->
               super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
               ).count;
      bVar7 = (int)firstUnknownJumpInfo < iVar16;
      if ((int)firstUnknownJumpInfo < iVar16) {
        lVar17 = (long)(int)firstUnknownJumpInfo;
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        local_44 = -1;
        do {
          pJVar4 = (pLVar3->
                   super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                   ).buffer;
          uVar14 = pJVar4[lVar17].patchOffset;
          if ((ulong)(this->m_byteCodeData).currentOffset - 2 < (ulong)uVar14) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar10 = 1;
            bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                        ,0xb28,
                                        "(jumpByteOffset <= this->m_byteCodeData.GetCurrentOffset() - sizeof(JumpOffset))"
                                        ,"Must have valid jump site within byte-code to back-patch")
            ;
            if (!bVar8) goto LAB_008a450c;
            *puVar10 = 0;
          }
          iVar16 = pJVar4[lVar17].labelId;
          CheckLabel(this,iVar16);
          pTVar11 = JsUtil::
                    List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item(this->m_labelOffsets,iVar16);
          TVar1 = *pTVar11;
          if (TVar1 == 0xffffffff) {
            UpdateNextBranchIslandOffset(this,firstUnknownJumpInfo,uVar14);
            iVar2 = this->nextBranchIslandOffset;
            bVar8 = ConfigFlagsTable::IsEnabled
                              ((ConfigFlagsTable *)&Configuration::Global,ByteCodeBranchLimitFlag);
            iVar15 = -0x4000;
            if (bVar8) {
              uVar14 = DAT_015b5fb8;
              if ((int)DAT_015b5fb8 < 0x41) {
                uVar14 = 0x40;
              }
              if (0x7fff < (int)uVar14) {
                uVar14 = 0x8000;
              }
              iVar15 = -(uVar14 >> 1);
            }
            bVar8 = true;
            if (iVar15 + iVar2 <= (int)local_38) {
              if (iVar16 == local_44) {
                if (firstUnknownJumpInfo !=
                    (this->m_jumpOffsets->
                    super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count - 1U) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar10 = 1;
                  bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                              ,0xb48,"(index == m_jumpOffsets->Count() - 1)",
                                              "index == m_jumpOffsets->Count() - 1");
                  if (!bVar9) goto LAB_008a450c;
                  *puVar10 = 0;
                }
                if (this->nextBranchIslandOffset <= (int)local_38) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar10 = 1;
                  bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                              ,0xb49,
                                              "(currentOffset < this->nextBranchIslandOffset)",
                                              "currentOffset < this->nextBranchIslandOffset");
                  if (!bVar9) goto LAB_008a450c;
                  *puVar10 = 0;
                }
              }
              else {
                this->inEnsureLongBranch = true;
                labelID = DefineLabel(this);
                pJVar4[lVar17].labelId = labelID;
                if ((!bVar18 || bVar6) && local_44 == -1) {
                  local_44 = DefineLabel(this);
                  Br(this,Br,local_44);
                  if ((this->m_byteCodeData).currentOffset - local_38 != 3) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    *puVar10 = 1;
                    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                                ,0xb5d,
                                                "(this->m_byteCodeData.GetCurrentOffset() - currentOffset == JumpAroundSize)"
                                                ,
                                                "this->m_byteCodeData.GetCurrentOffset() - currentOffset == JumpAroundSize"
                                               );
                    if (!bVar8) goto LAB_008a450c;
                    *puVar10 = 0;
                  }
                  local_38 = local_38 + 3;
                }
                MarkLabel(this,labelID);
                BrLong(this,BrLong,iVar16);
                this->inEnsureLongBranch = false;
                if ((this->m_byteCodeData).currentOffset - local_38 != 7) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar10 = 1;
                  bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                              ,0xb6a,
                                              "(this->m_byteCodeData.GetCurrentOffset() - currentOffset == LongBranchSize)"
                                              ,
                                              "this->m_byteCodeData.GetCurrentOffset() - currentOffset == LongBranchSize"
                                             );
                  if (!bVar8) goto LAB_008a450c;
                  *puVar10 = 0;
                }
                local_38 = local_38 + 7;
                bVar8 = false;
              }
            }
          }
          else {
            bVar8 = ConfigFlagsTable::IsEnabled
                              ((ConfigFlagsTable *)&Configuration::Global,ByteCodeBranchLimitFlag);
            uVar13 = 0x8000;
            if (bVar8) {
              uVar13 = DAT_015b5fb8;
              if ((int)DAT_015b5fb8 < 0x41) {
                uVar13 = 0x40;
              }
              if (0x7fff < (int)uVar13) {
                uVar13 = 0x8000;
              }
            }
            iVar16 = TVar1 - uVar14;
            if (iVar16 < (int)uVar13) {
              bVar8 = ConfigFlagsTable::IsEnabled
                                ((ConfigFlagsTable *)&Configuration::Global,ByteCodeBranchLimitFlag)
              ;
              uVar14 = 0x8000;
              if (bVar8) {
                uVar14 = DAT_015b5fb8;
                if ((int)DAT_015b5fb8 < 0x41) {
                  uVar14 = 0x40;
                }
                if (0x7fff < (int)uVar14) {
                  uVar14 = 0x8000;
                }
              }
              if (SBORROW4(iVar16,-uVar14) != (int)(iVar16 + uVar14) < 0) goto LAB_008a41e5;
            }
            else {
LAB_008a41e5:
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar10 = 1;
              bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                          ,0xb34,
                                          "((int)labelByteOffset - (int)jumpByteOffset < GetBranchLimit() && (int)labelByteOffset - (int)jumpByteOffset >= -GetBranchLimit())"
                                          ,
                                          "(int)labelByteOffset - (int)jumpByteOffset < GetBranchLimit() && (int)labelByteOffset - (int)jumpByteOffset >= -GetBranchLimit()"
                                         );
              if (!bVar8) goto LAB_008a450c;
              *puVar10 = 0;
            }
            bVar8 = false;
          }
          if (bVar8) break;
          lVar17 = lVar17 + 1;
          lVar12 = (long)(pLVar3->
                         super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                         ).count;
          firstUnknownJumpInfo = firstUnknownJumpInfo + 1;
          bVar7 = lVar17 < lVar12;
        } while (lVar17 < lVar12);
      }
      else {
        local_44 = -1;
      }
      if (!bVar7) {
        UpdateNextBranchIslandOffset
                  (this,(this->m_jumpOffsets->
                        super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                        ).count,local_38);
      }
      if (local_44 != -1) {
        MarkLabel(this,local_44);
        return;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::EnsureLongBranch(Js::OpCode op)
    {
        Assert(useBranchIsland);
        int currentOffset = this->m_byteCodeData.GetCurrentOffset();

        // See if we need to emit branch island yet, and avoid recursion.
        if (currentOffset < this->nextBranchIslandOffset || this->inEnsureLongBranch)
        {
            lastOpcode = op;
            return;
        }

        // Leave actually may continue right after, it is only no fall through in the JIT.
        bool needBranchAround = OpCodeAttr::HasFallThrough(lastOpcode) || lastOpcode == Js::OpCode::Leave;
        lastOpcode = op;

        // If we are about to emit a no fall through op and the last was has fall through
        // then just emit the no fall through op, and then we can skip the branch around.
        // Except at label or StatementBoundary, we always want to emit before them.
        if ((needBranchAround && !OpCodeAttr::HasFallThrough(op))
            && op != Js::OpCode::StatementBoundary && op != Js::OpCode::Label)
        {
            return;
        }

        ByteCodeLabel branchAroundLabel = (Js::ByteCodeLabel)-1;
        bool foundUnknown = m_jumpOffsets->MapUntilFrom(firstUnknownJumpInfo,
            [=, &branchAroundLabel, &currentOffset](int index, JumpInfo& jumpInfo)
        {
            //
            // Read "labelID" stored at the offset within the byte-code.
            //
            uint jumpByteOffset = jumpInfo.patchOffset;
            AssertMsg(jumpByteOffset <= this->m_byteCodeData.GetCurrentOffset() - sizeof(JumpOffset),
                "Must have valid jump site within byte-code to back-patch");

            ByteCodeLabel labelID = jumpInfo.labelId;
            CheckLabel(labelID);

            // See if the label has bee marked yet.
            uint const labelByteOffset = m_labelOffsets->Item(labelID);
            if (labelByteOffset != UINT_MAX)
            {
                // If a label is already defined, then it should be short
                // (otherwise we should have emitted a branch island for it already).
                Assert((int)labelByteOffset - (int)jumpByteOffset < GetBranchLimit()
                    && (int)labelByteOffset - (int)jumpByteOffset >= -GetBranchLimit());
                return false;
            }

            this->UpdateNextBranchIslandOffset(index, jumpByteOffset);
            // Flush all the jump that are half of the way to the limit as well so we don't have
            // as many jump around of branch island.
            int flushNextBranchIslandOffset = this->nextBranchIslandOffset - GetBranchLimit() / 2;
            if (currentOffset < flushNextBranchIslandOffset)
            {
                // No need to for long branch yet. Terminate the loop.
                return true;
            }

            if (labelID == branchAroundLabel)
            {
                // Let's not flush the branchAroundLabel.
                // Should happen very rarely and mostly when the branch limit is very small.

                // This should be the last short jump we have just emitted (below).
                Assert(index == m_jumpOffsets->Count() - 1);
                Assert(currentOffset < this->nextBranchIslandOffset);
                return true;
            }

            // Emit long branch

            // Prevent recursion when we emit byte code here
            this->inEnsureLongBranch = true;

            // Create the branch label and update the jumpInfo.
            // Need to update the jumpInfo before we add the branch island as that might resize the m_jumpOffsets list.
            ByteCodeLabel longBranchLabel = this->DefineLabel();
            jumpInfo.labelId = longBranchLabel;

            // Emit the branch around if it hasn't been emitted already
            if (branchAroundLabel == (Js::ByteCodeLabel)-1 && needBranchAround)
            {
                branchAroundLabel = this->DefineLabel();
                this->Br(Js::OpCode::Br, branchAroundLabel);

                Assert(this->m_byteCodeData.GetCurrentOffset() - currentOffset == JumpAroundSize);
                currentOffset += JumpAroundSize;

                // Continue to count he jumpAroundSize, because we may have to emit
                // yet another branch island right after if the jumpAroundSize is included.
            }

            // Emit the long branch
            this->MarkLabel(longBranchLabel);
            this->BrLong(Js::OpCode::BrLong, labelID);

            this->inEnsureLongBranch = false;

            Assert(this->m_byteCodeData.GetCurrentOffset() - currentOffset == LongBranchSize);
            currentOffset += LongBranchSize;
            return false;
        });

        if (!foundUnknown)
        {
            // Nothing is found, just set the next branch island from the current offset
            this->UpdateNextBranchIslandOffset(this->m_jumpOffsets->Count(), currentOffset);
        }

        if (branchAroundLabel != (Js::ByteCodeLabel)-1)
        {
            // Make the branch around label if we needed one
            this->MarkLabel(branchAroundLabel);
        }
    }